

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O2

size_t __thiscall
avro::parsing::ValidatingDecoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_>::
arrayNext(ValidatingDecoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_> *this)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleParser<avro::parsing::DummyHandler> *this_00;
  size_t n;
  
  iVar1 = (*((this->base).px)->_vptr_Decoder[0x11])();
  n = CONCAT44(extraout_var,iVar1);
  this_00 = &this->parser;
  if (n == 0) {
    SimpleParser<avro::parsing::DummyHandler>::popRepeater(this_00);
    SimpleParser<avro::parsing::DummyHandler>::advance(this_00,sArrayEnd);
  }
  else {
    SimpleParser<avro::parsing::DummyHandler>::setRepeatCount(this_00,n);
  }
  return n;
}

Assistant:

size_t ValidatingDecoder<P>::arrayNext()
{
    size_t result = base->arrayNext();
    if (result == 0) {
        parser.popRepeater();
        parser.advance(Symbol::sArrayEnd);
    } else {
        parser.setRepeatCount(result);
    }
    return result;
}